

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

NaReal __thiscall NaVector::median(NaVector *this)

{
  ulong uVar1;
  int iVar2;
  NaReal extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  NaReal local_30;
  NaVector rVect;
  
  iVar2 = (*this->_vptr_NaVector[6])();
  if (iVar2 == 0) {
    local_30 = 0.0;
  }
  else {
    NaVector(&rVect,this);
    sort(&rVect);
    if ((rVect.nDim & 0x80000001) == 1) {
      (*rVect._vptr_NaVector[9])(&rVect,(ulong)(rVect.nDim - 1 >> 1));
      local_30 = extraout_XMM0_Qa;
    }
    else {
      uVar1 = (long)(int)rVect.nDim / 2;
      (*rVect._vptr_NaVector[9])
                (&rVect,(ulong)((int)uVar1 - 1),(long)(int)rVect.nDim % 2 & 0xffffffff);
      (*rVect._vptr_NaVector[9])(&rVect,uVar1 & 0xffffffff);
      local_30 = (extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01) * 0.5;
    }
    ~NaVector(&rVect);
  }
  return local_30;
}

Assistant:

NaReal
NaVector::median () const
{
  if(0 == dim())
    return 0.0;

  NaVector	rVect(*this);
  int		N = rVect.dim();

  rVect.sort();

  if(1 == N % 2){
    return rVect((N - 1) / 2);
  }else{
    return (rVect((N / 2) - 1) +
	    rVect((N / 2))) / 2;
  }
}